

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAtomicCase3::Run(BasicAtomicCase3 *this)

{
  bool bVar1;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  Vector<unsigned_int,_3> local_30;
  Vector<unsigned_int,_3> local_24;
  BasicAtomicCase3 *local_18;
  BasicAtomicCase3 *this_local;
  
  local_18 = this;
  tcu::Vector<unsigned_int,_3>::Vector(&local_24,0x40,1,1);
  bVar1 = RunIteration(this,&local_24,false);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<unsigned_int,_3>::Vector(&local_30,1,1,0x40);
    bVar1 = RunIteration(this,&local_30,true);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_3>::Vector(&local_3c,1,1,4);
      bVar1 = RunIteration(this,&local_3c,false);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<unsigned_int,_3>::Vector(&local_48,3,2,1);
        bVar1 = RunIteration(this,&local_48,true);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<unsigned_int,_3>::Vector(&local_54,2,4,2);
          bVar1 = RunIteration(this,&local_54,false);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<unsigned_int,_3>::Vector(&local_60,2,4,7);
            bVar1 = RunIteration(this,&local_60,true);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              this_local = (BasicAtomicCase3 *)0x0;
            }
            else {
              this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAtomicCase3 *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), true))
			return ERROR;
		return NO_ERROR;
	}